

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXConverter::SetShadingPropertiesCommon
          (FBXConverter *this,aiMaterial *out_mat,PropertyTable *props)

{
  char *pcVar1;
  allocator *pInput;
  bool ok;
  float local_cc;
  string local_c8;
  float CalculatedOpacity;
  allocator local_9d;
  float DispFactor;
  float BumpFactor;
  float ReflectionFactor;
  float TransparencyFactor;
  float Opacity;
  float ShininessExponent;
  float SpecularFactor;
  undefined1 local_80 [36];
  undefined1 local_5c [8];
  float local_54;
  undefined1 local_50 [12];
  undefined1 local_44 [12];
  undefined1 local_38 [12];
  
  pcVar1 = "Diffuse";
  std::__cxx11::string::string((string *)&local_c8,"Diffuse",(allocator *)local_80);
  GetColorPropertyFromMaterial
            ((FBXConverter *)&stack0xffffffffffffffd4,(PropertyTable *)pcVar1,(string *)props,
             (bool *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  if (ok == true) {
    aiMaterial::AddProperty(out_mat,(aiColor3D *)&stack0xffffffffffffffd4,1,"$clr.diffuse",0,0);
  }
  pcVar1 = "Emissive";
  std::__cxx11::string::string((string *)&local_c8,"Emissive",(allocator *)local_80);
  GetColorPropertyFromMaterial
            ((FBXConverter *)local_38,(PropertyTable *)pcVar1,(string *)props,(bool *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  if (ok == true) {
    aiMaterial::AddProperty(out_mat,(aiColor3D *)local_38,1,"$clr.emissive",0,0);
  }
  pcVar1 = "Ambient";
  std::__cxx11::string::string((string *)&local_c8,"Ambient",(allocator *)local_80);
  GetColorPropertyFromMaterial
            ((FBXConverter *)local_44,(PropertyTable *)pcVar1,(string *)props,(bool *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  if (ok == true) {
    aiMaterial::AddProperty(out_mat,(aiColor3D *)local_44,1,"$clr.ambient",0,0);
  }
  pcVar1 = "SpecularColor";
  std::__cxx11::string::string((string *)&local_c8,"SpecularColor",(allocator *)local_80);
  GetColorProperty((FBXConverter *)local_50,(PropertyTable *)pcVar1,(string *)props,
                   (bool *)&local_c8,SUB81(&ok,0));
  std::__cxx11::string::~string((string *)&local_c8);
  if (ok == true) {
    aiMaterial::AddProperty(out_mat,(aiColor3D *)local_50,1,"$clr.specular",0,0);
  }
  std::__cxx11::string::string((string *)&local_c8,"SpecularFactor",(allocator *)local_80);
  local_cc = PropertyGet<float>(props,&local_c8,&ok,true);
  std::__cxx11::string::~string((string *)&local_c8);
  SpecularFactor = local_cc;
  if (ok == true) {
    aiMaterial::AddProperty(out_mat,&SpecularFactor,1,"$mat.shinpercent",0,0);
  }
  std::__cxx11::string::string((string *)&local_c8,"ShininessExponent",(allocator *)local_80);
  local_cc = PropertyGet<float>(props,&local_c8,&ok,false);
  std::__cxx11::string::~string((string *)&local_c8);
  ShininessExponent = local_cc;
  if (ok == true) {
    aiMaterial::AddProperty(out_mat,&ShininessExponent,1,"$mat.shininess",0,0);
  }
  pInput = (allocator *)&CalculatedOpacity;
  std::__cxx11::string::string((string *)&local_c8,"TransparentColor",pInput);
  pcVar1 = "TransparencyFactor";
  std::__cxx11::string::string
            ((string *)local_80,"TransparencyFactor",(allocator *)&TransparencyFactor);
  GetColorPropertyFactored
            ((FBXConverter *)local_5c,(PropertyTable *)pcVar1,(string *)props,&local_c8,
             (bool *)local_80,SUB81(&ok,0));
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)&local_c8);
  CalculatedOpacity = 1.0;
  if (ok == true) {
    aiMaterial::AddProperty(out_mat,(aiColor3D *)local_5c,1,"$clr.transparent",0,0);
    CalculatedOpacity = ((float)local_5c._0_4_ + (float)local_5c._4_4_ + local_54) / -3.0 + 1.0;
  }
  std::__cxx11::string::string((string *)&local_c8,"TransparencyFactor",(allocator *)local_80);
  local_cc = PropertyGet<float>(props,&local_c8,&ok,false);
  std::__cxx11::string::~string((string *)&local_c8);
  TransparencyFactor = local_cc;
  if (ok == true) {
    aiMaterial::AddProperty(out_mat,&TransparencyFactor,1,"$mat.transparencyfactor",0,0);
  }
  std::__cxx11::string::string((string *)&local_c8,"Opacity",(allocator *)local_80);
  local_cc = PropertyGet<float>(props,&local_c8,&ok,false);
  std::__cxx11::string::~string((string *)&local_c8);
  Opacity = local_cc;
  if (ok == false) {
    if ((CalculatedOpacity == 1.0) && (!NAN(CalculatedOpacity))) goto LAB_0015ea6e;
  }
  else {
    pInput = (allocator *)&Opacity;
  }
  aiMaterial::AddProperty(out_mat,(float *)pInput,1,"$mat.opacity",0,0);
LAB_0015ea6e:
  pcVar1 = "ReflectionColor";
  std::__cxx11::string::string((string *)&local_c8,"ReflectionColor",(allocator *)&ReflectionFactor)
  ;
  GetColorProperty((FBXConverter *)local_80,(PropertyTable *)pcVar1,(string *)props,
                   (bool *)&local_c8,SUB81(&ok,0));
  std::__cxx11::string::~string((string *)&local_c8);
  if (ok == true) {
    aiMaterial::AddProperty(out_mat,(aiColor3D *)local_80,1,"$clr.reflective",0,0);
  }
  std::__cxx11::string::string((string *)&local_c8,"ReflectionFactor",(allocator *)&BumpFactor);
  local_cc = PropertyGet<float>(props,&local_c8,&ok,true);
  std::__cxx11::string::~string((string *)&local_c8);
  ReflectionFactor = local_cc;
  if (ok == true) {
    aiMaterial::AddProperty(out_mat,&ReflectionFactor,1,"$mat.reflectivity",0,0);
  }
  std::__cxx11::string::string((string *)&local_c8,"BumpFactor",(allocator *)&DispFactor);
  local_cc = PropertyGet<float>(props,&local_c8,&ok,false);
  std::__cxx11::string::~string((string *)&local_c8);
  BumpFactor = local_cc;
  if (ok == true) {
    aiMaterial::AddProperty(out_mat,&BumpFactor,1,"$mat.bumpscaling",0,0);
  }
  std::__cxx11::string::string((string *)&local_c8,"DisplacementFactor",&local_9d);
  local_cc = PropertyGet<float>(props,&local_c8,&ok,false);
  std::__cxx11::string::~string((string *)&local_c8);
  DispFactor = local_cc;
  if (ok == true) {
    aiMaterial::AddProperty(out_mat,&DispFactor,1,"$mat.displacementscaling",0,0);
  }
  return;
}

Assistant:

void FBXConverter::SetShadingPropertiesCommon(aiMaterial* out_mat, const PropertyTable& props)
        {
            // Set shading properties.
            // Modern FBX Files have two separate systems for defining these,
            // with only the more comprehensive one described in the property template.
            // Likely the other values are a legacy system,
            // which is still always exported by the official FBX SDK.
            //
            // Blender's FBX import and export mostly ignore this legacy system,
            // and as we only support recent versions of FBX anyway, we can do the same.
            bool ok;

            const aiColor3D& Diffuse = GetColorPropertyFromMaterial(props, "Diffuse", ok);
            if (ok) {
                out_mat->AddProperty(&Diffuse, 1, AI_MATKEY_COLOR_DIFFUSE);
            }

            const aiColor3D& Emissive = GetColorPropertyFromMaterial(props, "Emissive", ok);
            if (ok) {
                out_mat->AddProperty(&Emissive, 1, AI_MATKEY_COLOR_EMISSIVE);
            }

            const aiColor3D& Ambient = GetColorPropertyFromMaterial(props, "Ambient", ok);
            if (ok) {
                out_mat->AddProperty(&Ambient, 1, AI_MATKEY_COLOR_AMBIENT);
            }

            // we store specular factor as SHININESS_STRENGTH, so just get the color
            const aiColor3D& Specular = GetColorProperty(props, "SpecularColor", ok, true);
            if (ok) {
                out_mat->AddProperty(&Specular, 1, AI_MATKEY_COLOR_SPECULAR);
            }

            // and also try to get SHININESS_STRENGTH
            const float SpecularFactor = PropertyGet<float>(props, "SpecularFactor", ok, true);
            if (ok) {
                out_mat->AddProperty(&SpecularFactor, 1, AI_MATKEY_SHININESS_STRENGTH);
            }

            // and the specular exponent
            const float ShininessExponent = PropertyGet<float>(props, "ShininessExponent", ok);
            if (ok) {
                out_mat->AddProperty(&ShininessExponent, 1, AI_MATKEY_SHININESS);
            }

            // TransparentColor / TransparencyFactor... gee thanks FBX :rolleyes:
            const aiColor3D& Transparent = GetColorPropertyFactored(props, "TransparentColor", "TransparencyFactor", ok);
            float CalculatedOpacity = 1.0f;
            if (ok) {
                out_mat->AddProperty(&Transparent, 1, AI_MATKEY_COLOR_TRANSPARENT);
                // as calculated by FBX SDK 2017:
                CalculatedOpacity = 1.0f - ((Transparent.r + Transparent.g + Transparent.b) / 3.0f);
            }

            // try to get the transparency factor
            const float TransparencyFactor = PropertyGet<float>(props, "TransparencyFactor", ok);
            if (ok) {
                out_mat->AddProperty(&TransparencyFactor, 1, AI_MATKEY_TRANSPARENCYFACTOR);
            }

            // use of TransparencyFactor is inconsistent.
            // Maya always stores it as 1.0,
            // so we can't use it to set AI_MATKEY_OPACITY.
            // Blender is more sensible and stores it as the alpha value.
            // However both the FBX SDK and Blender always write an additional
            // legacy "Opacity" field, so we can try to use that.
            //
            // If we can't find it,
            // we can fall back to the value which the FBX SDK calculates
            // from transparency colour (RGB) and factor (F) as
            // 1.0 - F*((R+G+B)/3).
            //
            // There's no consistent way to interpret this opacity value,
            // so it's up to clients to do the correct thing.
            const float Opacity = PropertyGet<float>(props, "Opacity", ok);
            if (ok) {
                out_mat->AddProperty(&Opacity, 1, AI_MATKEY_OPACITY);
            }
            else if (CalculatedOpacity != 1.0) {
                out_mat->AddProperty(&CalculatedOpacity, 1, AI_MATKEY_OPACITY);
            }

            // reflection color and factor are stored separately
            const aiColor3D& Reflection = GetColorProperty(props, "ReflectionColor", ok, true);
            if (ok) {
                out_mat->AddProperty(&Reflection, 1, AI_MATKEY_COLOR_REFLECTIVE);
            }

            float ReflectionFactor = PropertyGet<float>(props, "ReflectionFactor", ok, true);
            if (ok) {
                out_mat->AddProperty(&ReflectionFactor, 1, AI_MATKEY_REFLECTIVITY);
            }

            const float BumpFactor = PropertyGet<float>(props, "BumpFactor", ok);
            if (ok) {
                out_mat->AddProperty(&BumpFactor, 1, AI_MATKEY_BUMPSCALING);
            }

            const float DispFactor = PropertyGet<float>(props, "DisplacementFactor", ok);
            if (ok) {
                out_mat->AddProperty(&DispFactor, 1, "$mat.displacementscaling", 0, 0);
    }
}